

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_uint.h
# Opt level: O0

int vec_uint_asc_compare(void *p1,void *p2)

{
  uint *pp2;
  uint *pp1;
  void *p2_local;
  void *p1_local;
  
  if (*p1 < *p2) {
    p1_local._4_4_ = -1;
  }
  else if (*p2 < *p1) {
    p1_local._4_4_ = 1;
  }
  else {
    p1_local._4_4_ = 0;
  }
  return p1_local._4_4_;
}

Assistant:

static inline int vec_uint_asc_compare(const void *p1, const void *p2)
{
    const unsigned *pp1 = (const unsigned *) p1;
    const unsigned *pp2 = (const unsigned *) p2;

    if ( *pp1 < *pp2 )
        return -1;
    if ( *pp1 > *pp2 )
        return 1;
    return 0;
}